

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cBufferStorageTests.cpp
# Opt level: O0

void __thiscall
gl4cts::BufferStorage::Buffer::InitData
          (Buffer *this,GLenum target,GLenum usage,GLsizeiptr size,GLvoid *data)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  GLvoid *data_local;
  GLsizeiptr size_local;
  GLenum usage_local;
  GLenum target_local;
  Buffer *this_local;
  Functions *gl_00;
  
  Release(this);
  this->m_target = target;
  pRVar2 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  gl_00 = (Functions *)CONCAT44(extraout_var,iVar1);
  Generate(gl_00,&this->m_id);
  Bind(gl_00,this->m_id,this->m_target);
  Data(gl_00,this->m_target,usage,size,data);
  return;
}

Assistant:

void Buffer::InitData(glw::GLenum target, glw::GLenum usage, glw::GLsizeiptr size, const glw::GLvoid* data)
{
	/* Delete previous buffer instance */
	Release();

	m_target = target;

	const Functions& gl = m_context.getRenderContext().getFunctions();

	Generate(gl, m_id);
	Bind(gl, m_id, m_target);
	Data(gl, m_target, usage, size, data);
}